

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteBlockDecl(BinaryWriter *this,BlockDeclaration *decl)

{
  Stream *pSVar1;
  Index IVar2;
  Type type;
  Index local_4c;
  Index index;
  Type local_20;
  BlockDeclaration *local_18;
  BlockDeclaration *decl_local;
  BinaryWriter *this_local;
  
  local_18 = decl;
  decl_local = (BlockDeclaration *)this;
  IVar2 = FuncSignature::GetNumParams(&decl->sig);
  if ((IVar2 == 0) && (IVar2 = FuncSignature::GetNumResults(&local_18->sig), IVar2 < 2)) {
    IVar2 = FuncSignature::GetNumResults(&local_18->sig);
    if (IVar2 == 0) {
      pSVar1 = this->stream_;
      Type::Type(&local_20,Void);
      WriteType(pSVar1,local_20,(char *)0x0);
    }
    else {
      IVar2 = FuncSignature::GetNumResults(&local_18->sig);
      if (IVar2 == 1) {
        pSVar1 = this->stream_;
        type = FuncSignature::GetResultType(&local_18->sig,0);
        WriteType(pSVar1,type,(char *)0x0);
      }
    }
  }
  else {
    if ((local_18->has_func_type & 1U) == 0) {
      local_4c = Module::GetFuncTypeIndex(this->module_,&local_18->sig);
    }
    else {
      local_4c = Module::GetFuncTypeIndex(this->module_,&local_18->type_var);
    }
    if (local_4c == 0xffffffff) {
      __assert_fail("index != kInvalidIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-writer.cc"
                    ,0x21b,
                    "void wabt::(anonymous namespace)::BinaryWriter::WriteBlockDecl(const BlockDeclaration &)"
                   );
    }
    WriteS32Leb128WithReloc(this,local_4c,"block type function index",TypeIndexLEB);
  }
  return;
}

Assistant:

void BinaryWriter::WriteBlockDecl(const BlockDeclaration& decl) {
  if (decl.sig.GetNumParams() == 0 && decl.sig.GetNumResults() <= 1) {
    if (decl.sig.GetNumResults() == 0) {
      WriteType(stream_, Type::Void);
    } else if (decl.sig.GetNumResults() == 1) {
      WriteType(stream_, decl.sig.GetResultType(0));
    }
    return;
  }

  Index index = decl.has_func_type ? module_->GetFuncTypeIndex(decl.type_var)
                                   : module_->GetFuncTypeIndex(decl.sig);
  assert(index != kInvalidIndex);
  WriteS32Leb128WithReloc(index, "block type function index",
                          RelocType::TypeIndexLEB);
}